

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regerror.c
# Opt level: O3

size_t regerror(int __errcode,regex_t *__preg,char *__errbuf,size_t __errbuf_size)

{
  uint uVar1;
  rerr *prVar2;
  int iVar3;
  rerr *prVar4;
  size_t sVar5;
  uint uVar6;
  char *pcVar7;
  size_t copy_len;
  char **ppcVar8;
  size_t sVar9;
  char convbuf [50];
  char acStack_68 [56];
  
  if (__errcode == 0xff) {
    if ((__preg == (regex_t *)0x0) || (pcVar7 = (char *)__preg->used, pcVar7 == (char *)0x0)) {
LAB_00105b43:
      if (__errbuf_size == 0) {
        return 2;
      }
      memcpy(__errbuf,"0",(ulong)(__errbuf_size != 1));
      __errbuf[__errbuf_size != 1] = '\0';
      return 2;
    }
    iVar3 = strcmp("REG_OKAY",pcVar7);
    if (iVar3 == 0) {
      uVar6 = 0;
    }
    else {
      ppcVar8 = &rerrs[1].name;
      do {
        uVar6 = ((rerr *)(ppcVar8 + -1))->code;
        if ((int)uVar6 < 0) goto LAB_00105b43;
        iVar3 = strcmp(*ppcVar8,pcVar7);
        ppcVar8 = ppcVar8 + 3;
      } while (iVar3 != 0);
    }
    pcVar7 = "%d";
LAB_00105bdb:
    snprintf(acStack_68,0x32,pcVar7,(ulong)uVar6);
    sVar5 = strlen(acStack_68);
    if (__errbuf_size != 0) {
      sVar9 = __errbuf_size - 1;
      if (sVar5 < __errbuf_size) {
        sVar9 = sVar5;
      }
      memcpy(__errbuf,acStack_68,sVar9);
      __errbuf[sVar9] = '\0';
    }
  }
  else {
    uVar6 = __errcode & 0xfffffeff;
    prVar2 = rerrs;
    do {
      prVar4 = prVar2;
      uVar1 = prVar4->code;
      if ((int)uVar1 < 0) break;
      prVar2 = prVar4 + 1;
    } while (uVar1 != uVar6);
    if (((uint)__errcode >> 8 & 1) == 0) {
      pcVar7 = prVar4->explain;
    }
    else {
      if ((int)uVar1 < 0) {
        pcVar7 = "REG_0x%x";
        goto LAB_00105bdb;
      }
      pcVar7 = prVar4->name;
    }
    sVar5 = strlen(pcVar7);
    if (__errbuf_size != 0) {
      sVar9 = __errbuf_size - 1;
      if (sVar5 < __errbuf_size) {
        sVar9 = sVar5;
      }
      memcpy(__errbuf,pcVar7,sVar9);
      __errbuf[sVar9] = '\0';
    }
  }
  return sVar5 + 1;
}

Assistant:

size_t
regerror(int errorcode, const regex_t *preg, char *errbuf, size_t errbuf_size)
{
	struct rerr *r;
	char convbuf[50];

	if (errorcode == REG_ATOI) {
		if (preg == NULL || preg->re_endp == NULL)
			return set_result(errbuf, errbuf_size, "0");
		for (r = rerrs; r->code >= 0; r++)
			if (strcmp(r->name, preg->re_endp) == 0)
				break;
		if (r->code < 0)
			return set_result(errbuf, errbuf_size, "0");
		snprintf(convbuf, sizeof convbuf, "%d", r->code);
		return set_result(errbuf, errbuf_size, convbuf);
	}
	else {
		int target = errorcode &~ REG_ITOA;
		
		for (r = rerrs; r->code >= 0; r++)
			if (r->code == target)
				break;
		if (errorcode & REG_ITOA) {
			if (r->code >= 0)
				return set_result(errbuf, errbuf_size, r->name);
			snprintf(convbuf, sizeof convbuf, "REG_0x%x", target);
			return set_result(errbuf, errbuf_size, convbuf);
		}
		return set_result(errbuf, errbuf_size, r->explain);
	}
}